

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O0

void dragon_death_check(int hp)

{
  ostream *poVar1;
  int local_84;
  duration<long,_std::ratio<1L,_1000L>_> local_80 [3];
  allocator local_61;
  string local_60 [32];
  string local_40 [36];
  int local_1c;
  duration<long,std::ratio<1l,1000l>> local_18 [12];
  int local_c;
  int hp_local;
  
  if (hp < 1) {
    local_1c = 700;
    local_c = hp;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_18,&local_1c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)local_18);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,anon_var_dwarf_c79c,&local_61);
    red_text(local_40);
    std::operator<<(poVar1,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    local_84 = 300;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)local_80,&local_84);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(local_80);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    pause();
    exit(0);
  }
  return;
}

Assistant:

void dragon_death_check(int hp){
	if(hp<=0)
    {
        this_thread::sleep_for(chrono::milliseconds(700));
        cout<<endl<<red_text("勇者擊敗了惡龍!");
        this_thread::sleep_for(chrono::milliseconds(300));
        cout<<endl;
        pause();
        exit(0);
    }
}